

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

callback<void_()> * __thiscall
booster::callback<void()>::operator=(callback<void_()> *this,intrusive_ptr<mycall> *c)

{
  intrusive_ptr<booster::callable<void_()>_> *in_RSI;
  callback<void_()> *in_RDI;
  intrusive_ptr<mycall> *in_stack_ffffffffffffffd8;
  intrusive_ptr<booster::callable<void_()>_> *in_stack_ffffffffffffffe8;
  
  intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr<mycall>
            (&in_RDI->call_ptr,in_stack_ffffffffffffffd8);
  intrusive_ptr<booster::callable<void_()>_>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&in_RDI->call_ptr);
  return in_RDI;
}

Assistant:

callback const &operator=(intrusive_ptr<Call> c)		
		{ call_ptr = c; return *this; }